

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O3

DdNode * Llb_Nonlin4SweepPartitions_rec
                   (DdManager *dd,Aig_Obj_t *pObj,Vec_Int_t *vOrder,Vec_Ptr_t *vRoots)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  void **ppvVar4;
  DdNode *n;
  uint uVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  uVar5 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
  if (uVar5 != 2) {
    if (uVar5 == 1) {
      pDVar2 = Cudd_ReadOne(dd);
      return pDVar2;
    }
    pDVar2 = (DdNode *)(pObj->field_5).pData;
    if (pDVar2 == (DdNode *)0x0) {
      pDVar2 = Llb_Nonlin4SweepPartitions_rec
                         (dd,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vOrder,vRoots)
      ;
      pDVar2 = (DdNode *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pDVar2);
      if (uVar5 == 3) {
        iVar1 = pObj->Id;
        if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) goto LAB_007e933e;
        pDVar3 = Cudd_bddIthVar(dd,vOrder->pArray[iVar1]);
        pDVar2 = Cudd_bddXnor(dd,pDVar3,pDVar2);
        Cudd_Ref(pDVar2);
        uVar5 = vRoots->nSize;
        if (uVar5 == vRoots->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vRoots->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vRoots->pArray,0x80);
            }
            vRoots->pArray = ppvVar4;
            vRoots->nCap = 0x10;
          }
          else {
            if (vRoots->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vRoots->pArray,(ulong)uVar5 << 4);
            }
            vRoots->pArray = ppvVar4;
            vRoots->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar4 = vRoots->pArray;
        }
        iVar1 = vRoots->nSize;
        vRoots->nSize = iVar1 + 1;
        ppvVar4[iVar1] = pDVar2;
        pDVar2 = (DdNode *)0x0;
      }
      else {
        pDVar3 = Llb_Nonlin4SweepPartitions_rec
                           (dd,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vOrder,
                            vRoots);
        pDVar3 = Cudd_bddAnd(dd,pDVar2,(DdNode *)((ulong)((uint)pObj->pFanin1 & 1) ^ (ulong)pDVar3))
        ;
        Cudd_Ref(pDVar3);
        iVar1 = Llb_ObjBddVar(vOrder,(Aig_Obj_t *)(ulong)(uint)pObj->Id);
        pDVar2 = pDVar3;
        if (-1 < iVar1) {
          iVar1 = Llb_ObjBddVar(vOrder,(Aig_Obj_t *)(ulong)(uint)pObj->Id);
          pDVar2 = Cudd_bddIthVar(dd,iVar1);
          n = Cudd_bddXnor(dd,pDVar2,pDVar3);
          Cudd_Ref(n);
          Vec_PtrPush(vRoots,n);
          Cudd_RecursiveDeref(dd,pDVar3);
          Cudd_Ref(pDVar2);
        }
        (pObj->field_5).pData = pDVar2;
      }
    }
    return pDVar2;
  }
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (iVar1 < vOrder->nSize)) {
    pDVar2 = Cudd_bddIthVar(dd,vOrder->pArray[iVar1]);
    return pDVar2;
  }
LAB_007e933e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

DdNode * Llb_Nonlin4SweepPartitions_rec( DdManager * dd, Aig_Obj_t * pObj, Vec_Int_t * vOrder, Vec_Ptr_t * vRoots )
{
    DdNode * bBdd, * bBdd0, * bBdd1, * bPart, * vVar;
    if ( Aig_ObjIsConst1(pObj) )
        return Cudd_ReadOne(dd); 
    if ( Aig_ObjIsCi(pObj) )
        return Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    if ( pObj->pData )
        return (DdNode *)pObj->pData;
    if ( Aig_ObjIsCo(pObj) )
    {
        bBdd0 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin0(pObj), vOrder, vRoots), Aig_ObjFaninC0(pObj) );
        bPart = Cudd_bddXnor( dd, Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) ), bBdd0 );  Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
        return NULL;
    }
    bBdd0 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin0(pObj), vOrder, vRoots), Aig_ObjFaninC0(pObj) );
    bBdd1 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin1(pObj), vOrder, vRoots), Aig_ObjFaninC1(pObj) );
    bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( bBdd );
    if ( Llb_ObjBddVar(vOrder, pObj) >= 0 )
    {
        vVar  = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
        bPart = Cudd_bddXnor( dd, vVar, bBdd );  Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
        Cudd_RecursiveDeref( dd, bBdd );
        bBdd = vVar;  Cudd_Ref( vVar );
    }
    pObj->pData = bBdd;
    return bBdd;
}